

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

int Extra_bddCountCubes(DdManager *dd,DdNode **pFuncs,int nFuncs,int fMode,int nLimit,int *pGuide)

{
  int iVar1;
  st__table *table;
  DdNode *pDVar2;
  DdNode *pDVar3;
  int *piVar4;
  DdNode *L;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  int Count1;
  int Count0;
  int local_58;
  uint local_54;
  int *local_50;
  ulong local_48;
  st__table *local_40;
  uint local_38;
  int local_34;
  
  uVar5 = (ulong)(uint)fMode;
  local_50 = pGuide;
  table = st__init_table(st__ptrcmp,st__ptrhash);
  local_38 = dd->maxLive;
  dd->maxLive = (dd->keys - dd->dead) + 1000000;
  uVar7 = 0;
  uVar6 = 0;
  if (0 < nFuncs) {
    uVar6 = (ulong)(uint)nFuncs;
  }
  local_54 = fMode + 1;
  local_58 = 0;
  local_48 = uVar5;
  local_40 = table;
  local_34 = nFuncs;
  do {
    if (uVar6 == uVar7) {
LAB_00646709:
      dd->maxLive = local_38;
      st__free_table(table);
      iVar1 = -1;
      if ((int)uVar6 == local_34) {
        iVar1 = local_58;
      }
      return iVar1;
    }
    pDVar3 = pFuncs[uVar7];
    if (pDVar3 != (DdNode *)0x0) {
      Count1 = nLimit;
      Count0 = nLimit;
      if (((int)uVar5 == 1) || ((int)uVar5 == -1)) {
        pDVar2 = extraBddCountCubes(dd,pDVar3,pDVar3,table,&Count1,nLimit);
        bVar8 = pDVar2 != (DdNode *)0x0;
        pDVar3 = pFuncs[uVar7];
        L = (DdNode *)((ulong)pDVar3 ^ 1);
        pFuncs[uVar7] = L;
        table = local_40;
        if (local_54 < 2) goto LAB_00646650;
        pFuncs[uVar7] = pDVar3;
        if (pDVar2 == (DdNode *)0x0) goto LAB_00646706;
LAB_006466a7:
        local_50[uVar7] = 1;
        piVar4 = &Count1;
      }
      else {
        L = (DdNode *)((ulong)pDVar3 ^ 1);
        pFuncs[uVar7] = L;
        if (1 < local_54) {
          pFuncs[uVar7] = pDVar3;
LAB_00646706:
          uVar6 = uVar7 & 0xffffffff;
          goto LAB_00646709;
        }
        bVar8 = false;
LAB_00646650:
        pDVar3 = extraBddCountCubes(dd,L,L,table,&Count0,Count1);
        *(byte *)(pFuncs + uVar7) = *(byte *)(pFuncs + uVar7) ^ 1;
        if ((!bVar8) && (pDVar3 == (DdNode *)0x0)) {
          uVar6 = uVar7 & 0xffffffff;
          table = local_40;
          goto LAB_00646709;
        }
        if (pDVar3 == (DdNode *)0x0) goto LAB_006466a7;
        if (bVar8) {
          if (Count0 < Count1) {
            local_50[uVar7] = 0;
            piVar4 = &Count0;
          }
          else {
            local_50[uVar7] = 1;
            piVar4 = &Count1;
          }
        }
        else {
          local_50[uVar7] = 0;
          piVar4 = &Count0;
        }
      }
      local_58 = local_58 + *piVar4;
      table = local_40;
      uVar5 = local_48;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int Extra_bddCountCubes( DdManager * dd, DdNode ** pFuncs, int nFuncs, int fMode, int nLimit, int * pGuide )
{
    DdNode * pF0, * pF1; 
    int i, Count, Count0, Count1, CounterAll = 0;
    st__table *table = st__init_table( st__ptrcmp, st__ptrhash );
    unsigned int saveLimit = dd->maxLive;
    dd->maxLive = dd->keys - dd->dead + 1000000; // limit on intermediate BDD nodes
    for ( i = 0; i < nFuncs; i++ )
    {
        if ( !pFuncs[i] )
            continue;
        pF1 = pF0 = NULL;
        Count0 = Count1 = nLimit;
        if ( fMode == -1 || fMode == 1 ) // both or pos
            pF1 = extraBddCountCubes( dd, pFuncs[i], pFuncs[i], table, &Count1, nLimit );
        pFuncs[i] = Cudd_Not( pFuncs[i] );
        if ( fMode == -1 || fMode == 0 ) // both or neg
            pF0 = extraBddCountCubes( dd, pFuncs[i], pFuncs[i], table, &Count0, Count1 );
        pFuncs[i] = Cudd_Not( pFuncs[i] );
        if ( !pF1 && !pF0 )
            break;
        if ( !pF0 )                  pGuide[i] = 1, Count = Count1; // use pos
        else if ( !pF1 )             pGuide[i] = 0, Count = Count0; // use neg
        else if ( Count1 <= Count0 ) pGuide[i] = 1, Count = Count1; // use pos
        else                         pGuide[i] = 0, Count = Count0; // use neg
        CounterAll += Count;
        //printf( "Output %5d has %5d cubes (%d)  (%5d and %5d)\n", nOuts++, Count, pGuide[i], Count1, Count0 );
    }
    dd->maxLive = saveLimit;
    st__free_table( table );
    return i == nFuncs ? CounterAll : -1;
}